

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

void __thiscall AGSSockAPI::Thread::exit(Thread *this,int __status)

{
  Lock local_18;
  Lock lock;
  Thread *this_local;
  
  lock.mutex_ = (Mutex *)this;
  if (this->data != (Data *)0x0) {
    Mutex::Lock::Lock(&local_18,&this->data->mutex);
    this->data->active = false;
    Mutex::Lock::~Lock(&local_18);
    return;
  }
  __assert_fail("data != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FTPlus[P]AGSsock/src/API.cpp"
                ,0x119,"void AGSSockAPI::Thread::exit()");
}

Assistant:

void Thread::exit()
{
	assert(data != nullptr);

	{
		Mutex::Lock lock(data->mutex);

		data->active = false;
	}
}